

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O3

int Rand_sample(int mean,int upper,int lower,int stand_u,int stand_l)

{
  int16_t iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = Rand_normal(0,1000);
  if (iVar1 < 1) {
    if (-1 < iVar1) goto LAB_00213ff7;
    iVar2 = mean - lower;
    stand_u = stand_l;
  }
  else {
    iVar2 = upper - mean;
  }
  iVar2 = (iVar1 * iVar2) / (stand_u * 100);
LAB_00213ff7:
  return iVar2 + mean;
}

Assistant:

int Rand_sample(int mean, int upper, int lower, int stand_u, int stand_l)
{
	int pick = Rand_normal(0, 1000);

	/* Scale to fit */
	if (pick > 0) {
		/* Positive pick, scale up */
		pick *= (upper - mean);
		pick /= (100 * stand_u);
	} else if (pick < 0) {
		/* Negative pick, scale down */
		pick *= (mean - lower);
		pick /= (100 * stand_l);
	}

	return mean + pick;
}